

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ContBind *curr,
          optional<wasm::HeapType> src,optional<wasm::HeapType> dest)

{
  size_t sVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Type *pTVar4;
  size_t i;
  size_t index;
  Signature SVar5;
  HeapType local_80;
  Type local_78;
  ContBind *local_70;
  _Storage<wasm::HeapType,_true> local_68;
  optional<wasm::HeapType> dest_local;
  optional<wasm::HeapType> src_local;
  Type sourceParams;
  Type targetParams;
  
  local_68 = dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ =
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._8_8_ = wasm::Type::getHeapType(&curr->cont->type);
    src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  if (((undefined1  [16])
       dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_68._M_value =
         wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)91>).super_Expression.
                     type);
    dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  sourceParams.id =
       (uintptr_t)
       HeapType::getContinuation
                 ((HeapType *)
                  &dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_engaged);
  SVar5 = HeapType::getSignature((HeapType *)&sourceParams);
  src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = SVar5.params.id;
  local_80.id = (uintptr_t)HeapType::getContinuation(&local_68._M_value);
  SVar5 = HeapType::getSignature(&local_80);
  sourceParams = SVar5.params.id;
  sVar1 = wasm::Type::size((Type *)&src_local.super__Optional_base<wasm::HeapType,_true,_true>.
                                    _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                    _M_engaged);
  sVar2 = wasm::Type::size(&sourceParams);
  if (sVar2 <= sVar1) {
    sVar1 = wasm::Type::size((Type *)&src_local.super__Optional_base<wasm::HeapType,_true,_true>.
                                      _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                      _M_engaged);
    sVar2 = wasm::Type::size(&sourceParams);
    if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements == sVar1 - sVar2) {
      local_70 = curr;
      for (index = 0; sVar1 - sVar2 != index; index = index + 1) {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        pTVar4 = wasm::Type::operator[]
                           ((Type *)&src_local.super__Optional_base<wasm::HeapType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<wasm::HeapType>.
                                     _M_engaged,index);
        IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                  ((ConstraintCollector *)this,ppEVar3,(Type)pTVar4->id);
      }
      ppEVar3 = &local_70->cont;
      wasm::Type::Type(&local_78,
                       (HeapType)
                       dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._8_8_,Nullable,Inexact);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,ppEVar3,local_78);
      return;
    }
    __assert_fail("curr->operands.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x45b,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind(ContBind *, std::optional<HeapType>, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  __assert_fail("sourceParams.size() >= targetParams.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x459,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind(ContBind *, std::optional<HeapType>, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitContBind(ContBind* curr,
                     std::optional<HeapType> src = std::nullopt,
                     std::optional<HeapType> dest = std::nullopt) {
    if (!src.has_value()) {
      src = curr->cont->type.getHeapType();
    }
    if (!dest.has_value()) {
      dest = curr->type.getHeapType();
    }
    auto sourceParams = src->getContinuation().type.getSignature().params;
    auto targetParams = dest->getContinuation().type.getSignature().params;
    assert(sourceParams.size() >= targetParams.size());
    auto n = sourceParams.size() - targetParams.size();
    assert(curr->operands.size() == n);
    for (size_t i = 0; i < n; ++i) {
      note(&curr->operands[i], sourceParams[i]);
    }
    note(&curr->cont, Type(*src, Nullable));
  }